

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O3

Bmcs_Man_t * Bmcs_ManStart(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  int iVar1;
  uint uVar2;
  Bmcs_Man_t *pBVar3;
  Gia_Man_t *p;
  void **ppvVar4;
  int *piVar5;
  satoko_t *s;
  long lVar6;
  size_t __size;
  int iVar7;
  int Lit;
  int local_9c;
  satoko_opts_t local_98;
  
  pBVar3 = (Bmcs_Man_t *)calloc(1,0x3a0);
  local_9c = 1;
  satoko_default_opts(&local_98);
  local_98.conf_limit = (long)pPars->nConfLimit;
  if (pGia->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(pGia) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcS.c"
                  ,0x174,"Bmcs_Man_t *Bmcs_ManStart(Gia_Man_t *, Bmc_AndPar_t *)");
  }
  pBVar3->pPars = pPars;
  pBVar3->pGia = pGia;
  p = Gia_ManStart(pGia->nObjs * 3);
  pBVar3->pFrames = p;
  Gia_ManHashStart(p);
  ppvVar4 = (void **)malloc(8000);
  (pBVar3->vGia2Fr).pArray = ppvVar4;
  (pBVar3->vGia2Fr).nCap = 1000;
  iVar1 = pGia->vCis->nSize;
  if (0 < iVar1) {
    uVar2 = iVar1 * 3;
    piVar5 = (int *)malloc((ulong)uVar2 << 2);
    (pBVar3->vFr2Sat).pArray = piVar5;
    if (piVar5 == (int *)0x0) goto LAB_00577555;
    (pBVar3->vFr2Sat).nCap = uVar2;
  }
  Vec_IntPush(&pBVar3->vFr2Sat,0);
  iVar1 = pGia->vCis->nSize;
  iVar7 = iVar1 * 3;
  if ((pBVar3->vCiMap).nCap < iVar7) {
    piVar5 = (pBVar3->vCiMap).pArray;
    __size = (long)iVar1 * 0xc;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc(__size);
    }
    else {
      piVar5 = (int *)realloc(piVar5,__size);
    }
    (pBVar3->vCiMap).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
LAB_00577555:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pBVar3->vCiMap).nCap = iVar7;
  }
  if (0 < pPars->nProcs) {
    lVar6 = 0;
    do {
      local_98.b_rst = (double)(int)lVar6 * -0.05;
      local_98.f_rst = local_98.b_rst + 0.8;
      local_98.b_rst = local_98.b_rst + 1.4;
      local_98.garbage_max_ratio = (float)((double)(int)lVar6 * 0.05 + 0.30000001192092896);
      s = satoko_create();
      pBVar3->pSats[lVar6] = s;
      satoko_configure(s,&local_98);
      satoko_add_variable(pBVar3->pSats[lVar6],'\0');
      satoko_add_clause(pBVar3->pSats[lVar6],&local_9c,1);
      satoko_set_stop(pBVar3->pSats[lVar6],&pBVar3->fStopNow);
      lVar6 = lVar6 + 1;
    } while (lVar6 < pPars->nProcs);
  }
  pBVar3->nSatVars = 1;
  return pBVar3;
}

Assistant:

Bmcs_Man_t * Bmcs_ManStart( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    Bmcs_Man_t * p = ABC_CALLOC( Bmcs_Man_t, 1 ); 
    int i, Lit = Abc_Var2Lit( 0, 1 );
    satoko_opts_t opts;
    satoko_default_opts(&opts);
    opts.conf_limit = pPars->nConfLimit;
    assert( Gia_ManRegNum(pGia) > 0 );
    p->pPars   = pPars;
    p->pGia    = pGia;
    p->pFrames = Gia_ManStart( 3*Gia_ManObjNum(pGia) );  Gia_ManHashStart(p->pFrames);
    p->pClean  = NULL;
//    Vec_PtrFill( &p->vGia2Fr, Gia_ManCountTents(pGia)+1, NULL );
//    for ( i = 0; i < Vec_PtrSize(&p->vGia2Fr); i++ )
//        Vec_PtrWriteEntry( &p->vGia2Fr, i, ABC_FALLOC(int, Gia_ManObjNum(pGia)) );
    Vec_PtrGrow( &p->vGia2Fr, 1000 );  
    Vec_IntGrow( &p->vFr2Sat, 3*Gia_ManCiNum(pGia) );  
    Vec_IntPush( &p->vFr2Sat, 0 );
    Vec_IntGrow( &p->vCiMap, 3*Gia_ManCiNum(pGia) );
    for ( i = 0; i < pPars->nProcs; i++ )
    {
        // modify parameters to get different SAT solvers
        opts.f_rst = 0.8 - i * 0.05;
        opts.b_rst = 1.4 - i * 0.05;
        opts.garbage_max_ratio = (float) 0.3 + i * 0.05;
        // create SAT solvers
        p->pSats[i] = bmc_sat_solver_start( i );  
#ifdef ABC_USE_EXT_SOLVERS
        p->pSats[i]->SolverType = i;
#else
        satoko_configure(p->pSats[i], &opts);
#endif
        bmc_sat_solver_addvar( p->pSats[i] );
        bmc_sat_solver_addclause( p->pSats[i], &Lit, 1 );  
        bmc_sat_solver_setstop( p->pSats[i], &p->fStopNow );
    }
    p->nSatVars = 1;
    return p;
}